

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdJoin.cpp
# Opt level: O0

int CmdJoin(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  string *this;
  size_type sVar4;
  reference piVar5;
  string *__return_storage_ptr__;
  reference pvVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference tag_00;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Interval combined;
  Interval second;
  Interval first;
  string local_1a0;
  reference local_180;
  Interval *interval;
  iterator __end3;
  iterator __begin3;
  vector<Interval,_std::allocator<Interval>_> *__range3;
  bool found;
  int *id;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  vector<Interval,_std::allocator<Interval>_> intervals;
  undefined1 local_f0 [8];
  IntervalFilterAllWithIds filtering;
  undefined1 local_98 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  Journal *pJStack_28;
  bool verbose;
  Journal *journal_local;
  Database *database_local;
  Rules *rules_local;
  CLI *cli_local;
  
  pJStack_28 = journal;
  journal_local = (Journal *)database;
  database_local = (Database *)rules;
  rules_local = (Rules *)cli;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"verbose",&local_51);
  bVar1 = Rules::getBoolean(rules,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar1;
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)local_98,(CLI *)rules_local);
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (sVar3 != 2) {
    filtering._id_end._M_node._6_1_ = 1;
    this = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,"Two IDs must be specified. See \'timew help join\'.",
               (allocator<char> *)((long)&filtering._id_end._M_node + 7));
    filtering._id_end._M_node._6_1_ = 0;
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(pJStack_28);
  flattenDatabase((Database *)journal_local,(Rules *)database_local);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            ((IntervalFilterAllWithIds *)local_f0,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  getTracked((vector<Interval,_std::allocator<Interval>_> *)&__range2,(Database *)journal_local,
             (Rules *)database_local,(IntervalFilter *)local_f0);
  sVar4 = std::vector<Interval,_std::allocator<Interval>_>::size
                    ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (sVar4 != sVar3) {
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    id = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&id), bVar1) {
      piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      bVar1 = false;
      __end3 = std::vector<Interval,_std::allocator<Interval>_>::begin
                         ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      interval = (Interval *)
                 std::vector<Interval,_std::allocator<Interval>_>::end
                           ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                         *)&interval), bVar2) {
        local_180 = __gnu_cxx::
                    __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                    ::operator*(&__end3);
        if (local_180->id == *piVar5) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
        ::operator++(&__end3);
      }
      if (!bVar1) {
        first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"ID \'@{1}\' does not correspond to any tracking.",
                   (allocator<char> *)
                   ((long)&first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        format<int>(__return_storage_ptr__,&local_1a0,*piVar5);
        first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
  }
  pvVar6 = std::vector<Interval,_std::allocator<Interval>_>::operator[]
                     ((vector<Interval,_std::allocator<Interval>_> *)&__range2,1);
  Interval::Interval((Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     pvVar6);
  pvVar6 = std::vector<Interval,_std::allocator<Interval>_>::operator[]
                     ((vector<Interval,_std::allocator<Interval>_> *)&__range2,0);
  Interval::Interval((Interval *)&combined._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     pvVar6);
  Interval::Interval((Interval *)&__range1,
                     (Interval *)&combined._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  combined.super_Range.end._seconds = first.super_Range.end._seconds;
  combined.super_Range.end._offset = first.super_Range.end._offset;
  combined.super_Range.end._utc = first.super_Range.end._utc;
  combined.super_Range.end._33_7_ = first.super_Range.end._33_7_;
  combined.super_Range.end._week = first.super_Range.end._week;
  combined.super_Range.end._weekday = first.super_Range.end._weekday;
  combined.super_Range.end._julian = first.super_Range.end._julian;
  combined.super_Range.end._day = first.super_Range.end._day;
  combined.super_Range.start._date = first.super_Range.start._date;
  combined.super_Range.end._year = first.super_Range.end._year;
  combined.super_Range.end._month = first.super_Range.end._month;
  this_00 = Interval::tags_abi_cxx11_
                      ((Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&tag), bVar1) {
    tag_00 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    Interval::tag((Interval *)&__range1,tag_00);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  Database::deleteInterval
            ((Database *)journal_local,
             (Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Database::deleteInterval
            ((Database *)journal_local,
             (Interval *)&combined._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  validate((CLI *)rules_local,(Rules *)database_local,(Database *)journal_local,
           (Interval *)&__range1);
  Database::addInterval((Database *)journal_local,(Interval *)&__range1,(bool)(local_29 & 1));
  Journal::endTransaction(pJStack_28);
  if ((local_29 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Joined @");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)first.super_Range.end._date);
    poVar7 = std::operator<<(poVar7," and @");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)second.super_Range.end._date);
    std::operator<<(poVar7,'\n');
  }
  Interval::~Interval((Interval *)&__range1);
  Interval::~Interval((Interval *)&combined._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Interval::~Interval((Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  IntervalFilterAllWithIds::~IntervalFilterAllWithIds((IntervalFilterAllWithIds *)local_f0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  return 0;
}

Assistant:

int CmdJoin (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  auto ids = cli.getIds ();

  // Only 2 IDs allowed in a join.
  if (ids.size () != 2)
  {
    throw std::string ("Two IDs must be specified. See 'timew help join'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  Interval first  = intervals[1];
  Interval second = intervals[0];

  // TODO Require confirmation if intervals are not consecutive.

  auto combined = second;
  combined.end = first.end;

  for (auto& tag: first.tags ())
  {
    combined.tag (tag);
  }

  database.deleteInterval (first);
  database.deleteInterval (second);

  validate (cli, rules, database, combined);
  database.addInterval (combined, verbose);

  journal.endTransaction ();

  if (verbose)
  {
    std::cout << "Joined @" << first.id << " and @" << second.id << '\n';
  }

  return 0;
}